

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O0

void __thiscall xemmai::t_root::~t_root(t_root *this)

{
  t_queue<256UL> *this_00;
  __pointer_type ptVar1;
  undefined8 *puVar2;
  __pointer_type p;
  t_root *this_local;
  
  ptVar1 = std::atomic<xemmai::t_object_*>::load((atomic<xemmai::t_object_*> *)this,relaxed);
  if ((__pointer_type)0x4 < ptVar1) {
    puVar2 = (undefined8 *)__tls_get_addr(&PTR_00133dd8);
    this_00 = (t_queue<256UL> *)*puVar2;
    *this_00->v_head = ptVar1;
    if (this_00->v_head == this_00->v_next) {
      xemmai::t_slot::t_queue<256UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
  }
  return;
}

Assistant:

~t_root()
	{
		auto p = v_p.load(std::memory_order_relaxed);
		if (reinterpret_cast<uintptr_t>(p) >= c_tag__OBJECT) t_decrements::f_push(p);
	}